

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int protocol;
  int family;
  int sock;
  int family_00;
  int sock_00;
  int sock_01;
  int family_01;
  int sock_02;
  int family_02;
  int family_03;
  int sock_03;
  int sock_04;
  int sock_05;
  int family_04;
  int family_05;
  int sock_06;
  int sock_07;
  int family_06;
  int sock_08;
  int family_07;
  int family_08;
  int sock_09;
  int sock_10;
  int sock_11;
  int sock_12;
  int sock_13;
  int family_09;
  int sock_14;
  int sock_15;
  char *pcVar4;
  void *in_R9;
  int iVar5;
  int opt;
  size_t sz;
  char any_address [128];
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char local_a8 [128];
  
  if (argc < 2) {
    sprintf(socket_address,"%s://%s:%d","ws","127.0.0.1",0x15b3);
    pcVar4 = "5555";
  }
  else {
    uVar1 = atoi(argv[1]);
    sprintf(socket_address,"%s://%s:%d","ws","127.0.0.1",(ulong)uVar1);
    pcVar4 = argv[1];
  }
  uVar1 = atoi(pcVar4);
  iVar2 = 0x1034f6;
  pcVar4 = "*";
  sprintf(local_a8,"%s://%s:%d","ws","*",(ulong)uVar1);
  iVar2 = test_socket_impl((char *)0x5e,iVar2,family,(int)pcVar4);
  test_bind_impl((char *)0x5f,iVar2,(int)local_a8,pcVar4);
  test_close_impl((char *)0x60,iVar2,sock);
  iVar2 = test_socket_impl((char *)0x64,iVar2,family_00,(int)pcVar4);
  test_connect_impl((char *)0x65,iVar2,sock_00,pcVar4);
  iVar3 = (int)pcVar4;
  test_close_impl((char *)0x66,iVar2,sock_01);
  iVar2 = test_socket_impl((char *)0x69,iVar2,family_01,iVar3);
  pcVar4 = &stack0xffffffffffffff4c;
  iVar3 = nn_getsockopt(iVar2,0xfffffffc,1);
  if (iVar3 == 0) {
    if (in_stack_ffffffffffffff4c != 2) goto LAB_00102aa4;
    iVar3 = nn_connect(iVar2,"ws://127.0.0.1");
    if (iVar3 < 0) goto LAB_00102aa9;
    iVar3 = nn_connect(iVar2,"ws://*:");
    if (-1 < iVar3) goto LAB_00102aae;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102ab3;
    iVar3 = nn_connect(iVar2,"ws://*:1000000");
    if (-1 < iVar3) goto LAB_00102ab8;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102abd;
    iVar3 = nn_connect(iVar2,"ws://*:some_port");
    if (-1 < iVar3) goto LAB_00102ac2;
    iVar3 = nn_connect(iVar2,"ws://eth10000;127.0.0.1:5555");
    if (-1 < iVar3) goto LAB_00102ac7;
    iVar3 = nn_errno();
    if (iVar3 != 0x13) goto LAB_00102acc;
    iVar3 = nn_bind(iVar2,"ws://127.0.0.1:");
    if (-1 < iVar3) goto LAB_00102ad1;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102ad6;
    iVar3 = nn_bind(iVar2,"ws://127.0.0.1:1000000");
    if (-1 < iVar3) goto LAB_00102adb;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102ae0;
    iVar3 = nn_bind(iVar2,"ws://eth10000:5555");
    if (-1 < iVar3) goto LAB_00102ae5;
    iVar3 = nn_errno();
    if (iVar3 != 0x13) goto LAB_00102aea;
    iVar3 = nn_connect(iVar2,"ws://:5555");
    if (-1 < iVar3) goto LAB_00102aef;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102af4;
    iVar3 = nn_connect(iVar2,"ws://-hostname:5555");
    if (-1 < iVar3) goto LAB_00102af9;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102afe;
    iVar3 = nn_connect(iVar2,"ws://abc.123.---.#:5555");
    if (-1 < iVar3) goto LAB_00102b03;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102b08;
    iVar3 = nn_connect(iVar2,"ws://[::1]:5555");
    if (-1 < iVar3) goto LAB_00102b0d;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102b12;
    iVar3 = nn_connect(iVar2,"ws://abc...123:5555");
    if (-1 < iVar3) goto LAB_00102b17;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102b1c;
    iVar3 = nn_connect(iVar2,"ws://.123:5555");
    if (-1 < iVar3) goto LAB_00102b21;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102b26;
    test_close_impl((char *)0xa0,iVar2,sock_02);
    iVar3 = test_socket_impl((char *)0xa2,iVar2,family_02,(int)pcVar4);
    iVar2 = iVar3;
    test_bind_impl((char *)0xa3,iVar3,0x106100,pcVar4);
    iVar2 = test_socket_impl((char *)0xa4,iVar2,family_03,(int)pcVar4);
    test_connect_impl((char *)0xa5,iVar2,sock_03,pcVar4);
    iVar5 = 100;
    do {
      test_send_impl((char *)0xaa,iVar2,0x103259,pcVar4);
      test_recv_impl((char *)0xab,iVar3,0x103259,pcVar4);
      test_send_impl((char *)0xad,iVar3,0x10325d,pcVar4);
      test_recv_impl((char *)0xae,iVar2,0x10325d,pcVar4);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    iVar5 = 100;
    do {
      test_send_impl((char *)0xb3,iVar2,0x103261,pcVar4);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    iVar5 = 100;
    do {
      test_recv_impl((char *)0xb6,iVar3,0x103261,pcVar4);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    test_close_impl((char *)0xb9,iVar2,sock_04);
    test_close_impl((char *)0xba,iVar3,sock_05);
    iVar3 = test_socket_impl((char *)0xbd,iVar3,family_04,(int)pcVar4);
    iVar2 = iVar3;
    test_bind_impl((char *)0xbe,iVar3,0x106100,pcVar4);
    protocol = (int)pcVar4;
    iVar2 = test_socket_impl((char *)0xbf,iVar2,family_05,protocol);
    iVar5 = nn_bind(iVar2,socket_address);
    if (-1 < iVar5) goto LAB_00102b2b;
    iVar5 = nn_errno();
    if (iVar5 != 0x62) goto LAB_00102b30;
    test_close_impl((char *)0xc4,iVar3,sock_06);
    test_close_impl((char *)0xc5,iVar2,sock_07);
    iVar2 = test_socket_impl((char *)0xc8,iVar2,family_06,protocol);
    iVar3 = nn_setsockopt(iVar2,0,0x10,&stack0xffffffffffffff4c,4);
    if (iVar3 < 0) goto LAB_00102b35;
    pcVar4 = &stack0xffffffffffffff4c;
    iVar3 = nn_setsockopt(iVar2,0,0x10,pcVar4,4);
    if (-1 < iVar3) goto LAB_00102b3a;
    iVar3 = nn_errno();
    if (iVar3 != 0x16) goto LAB_00102b3f;
    test_close_impl((char *)0xd0,iVar2,sock_08);
    iVar3 = test_socket_impl((char *)0xd3,iVar2,family_07,(int)pcVar4);
    iVar2 = iVar3;
    test_bind_impl((char *)0xd4,iVar3,0x106100,pcVar4);
    iVar2 = test_socket_impl((char *)0xd5,iVar2,family_08,(int)pcVar4);
    test_connect_impl((char *)0xd6,iVar2,sock_09,pcVar4);
    iVar5 = 1000;
    test_setsockopt_impl
              ((char *)0xd8,iVar2,0,4,(int)&stack0xffffffffffffff4c,in_R9,
               CONCAT44(1000,in_stack_ffffffffffffff48));
    if (iVar5 == 1000) {
      iVar5 = 1000;
      test_setsockopt_impl
                ((char *)0xdb,iVar3,0,5,(int)&stack0xffffffffffffff4c,in_R9,
                 CONCAT44(1000,in_stack_ffffffffffffff48));
      if (iVar5 == 1000) {
        pcVar4 = (char *)0x10;
        test_setsockopt_impl
                  ((char *)0xde,iVar3,0,0x10,(int)&stack0xffffffffffffff4c,in_R9,
                   CONCAT44(4,in_stack_ffffffffffffff48));
        test_send_impl((char *)0xdf,iVar2,0x103259,pcVar4);
        test_recv_impl((char *)0xe0,iVar3,0x103259,pcVar4);
        test_send_impl((char *)0xe1,iVar2,0x10329e,pcVar4);
        test_recv_impl((char *)0xe2,iVar3,0x10329e,pcVar4);
        test_send_impl((char *)0xe3,iVar2,0x1032a3,pcVar4);
        test_drop_impl((char *)0xe4,iVar3,sock_10,(int)pcVar4);
        pcVar4 = (char *)0x10;
        test_setsockopt_impl
                  ((char *)0xea,iVar3,0,0x10,(int)&stack0xffffffffffffff4c,in_R9,
                   CONCAT44(5,in_stack_ffffffffffffff48));
        test_connect_impl((char *)0xeb,iVar2,sock_11,pcVar4);
        test_send_impl((char *)0xec,iVar2,0x1032a3,pcVar4);
        test_recv_impl((char *)0xed,iVar3,0x1032a3,pcVar4);
        test_close_impl((char *)0xee,iVar3,sock_12);
        test_close_impl((char *)0xef,iVar2,sock_13);
        test_text();
        iVar2 = test_socket_impl((char *)0xf4,iVar2,family_09,(int)pcVar4);
        test_connect_impl((char *)0xf5,iVar2,sock_14,pcVar4);
        nn_sleep(100);
        test_close_impl((char *)0xf7,iVar2,sock_15);
        return 0;
      }
      goto LAB_00102b49;
    }
  }
  else {
    main_cold_1();
    main_cold_2();
LAB_00102aa4:
    main_cold_3();
LAB_00102aa9:
    main_cold_36();
LAB_00102aae:
    main_cold_35();
LAB_00102ab3:
    main_cold_4();
LAB_00102ab8:
    main_cold_34();
LAB_00102abd:
    main_cold_5();
LAB_00102ac2:
    main_cold_33();
LAB_00102ac7:
    main_cold_32();
LAB_00102acc:
    main_cold_6();
LAB_00102ad1:
    main_cold_31();
LAB_00102ad6:
    main_cold_7();
LAB_00102adb:
    main_cold_30();
LAB_00102ae0:
    main_cold_8();
LAB_00102ae5:
    main_cold_29();
LAB_00102aea:
    main_cold_9();
LAB_00102aef:
    main_cold_28();
LAB_00102af4:
    main_cold_10();
LAB_00102af9:
    main_cold_27();
LAB_00102afe:
    main_cold_11();
LAB_00102b03:
    main_cold_26();
LAB_00102b08:
    main_cold_12();
LAB_00102b0d:
    main_cold_25();
LAB_00102b12:
    main_cold_13();
LAB_00102b17:
    main_cold_24();
LAB_00102b1c:
    main_cold_14();
LAB_00102b21:
    main_cold_23();
LAB_00102b26:
    main_cold_15();
LAB_00102b2b:
    main_cold_22();
LAB_00102b30:
    main_cold_16();
LAB_00102b35:
    main_cold_21();
LAB_00102b3a:
    main_cold_20();
LAB_00102b3f:
    main_cold_17();
  }
  main_cold_18();
LAB_00102b49:
  main_cold_19();
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    int sb2;
    int opt;
    size_t sz;
    int i;
    char any_address[128];

    test_addr_from (socket_address, "ws", "127.0.0.1",
            get_test_port (argc, argv));

    test_addr_from (any_address, "ws", "*",
            get_test_port (argc, argv));

    /*  Try closing bound but unconnected socket. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, any_address);
    test_close (sb);

    /*  Try closing a TCP socket while it not connected. At the same time
        test specifying the local address for the connection. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Check socket options. */
    sz = sizeof (opt);
    rc = nn_getsockopt (sc, NN_WS, NN_WS_MSG_TYPE, &opt, &sz);
    errno_assert (rc == 0);
    nn_assert (sz == sizeof (opt));
    nn_assert (opt == NN_WS_MSG_TYPE_BINARY);

    /*  Default port 80 should be assumed if not explicitly declared. */
    rc = nn_connect (sc, "ws://127.0.0.1");
    errno_assert (rc >= 0);

    /*  Try using invalid address strings. */
    rc = nn_connect (sc, "ws://*:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:some_port");
    nn_assert (rc < 0);
    rc = nn_connect (sc, "ws://eth10000;127.0.0.1:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_bind (sc, "ws://127.0.0.1:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://127.0.0.1:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://eth10000:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_connect (sc, "ws://:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://-hostname:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.---.#:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://[::1]:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc...123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://.123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);

    test_close (sc);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");

        test_send (sb, "DEF");
        test_recv (sc, "DEF");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "0123456789012345678901234567890123456789");
    }

    test_close (sc);
    test_close (sb);

    /*  Test two sockets binding to the same address. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sb2 = test_socket (AF_SP, NN_PAIR);

    rc = nn_bind (sb2, socket_address);
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EADDRINUSE);
    test_close(sb);
    test_close(sb2);

    /*  Test that NN_RCVMAXSIZE can be -1, but not lower */
    sb = test_socket (AF_SP, NN_PAIR);
    opt = -1;
    rc = nn_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    nn_assert (rc >= 0);
    opt = -2;
    rc = nn_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    test_close (sb);

    /*  Test NN_RCVMAXSIZE limit */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    opt = 1000;
    test_setsockopt (sc, NN_SOL_SOCKET, NN_SNDTIMEO, &opt, sizeof (opt));
    nn_assert (opt == 1000);
    opt = 1000;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVTIMEO, &opt, sizeof (opt));
    nn_assert (opt == 1000);
    opt = 4;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    test_send (sc, "ABC");
    test_recv (sb, "ABC");
    test_send (sc, "ABCD");
    test_recv (sb, "ABCD");
    test_send (sc, "ABCDE");
    test_drop (sb, ETIMEDOUT);

    /*  Increase the size limit, reconnect, then try sending again. The reason a
        reconnect is necessary is because after a protocol violation, the
        connecting socket will not continue automatic reconnection attempts. */
    opt = 5;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    test_connect (sc, socket_address);
    test_send (sc, "ABCDE");
    test_recv (sb, "ABCDE");
    test_close (sb);
    test_close (sc);

    test_text ();

    /*  Test closing a socket that is waiting to connect. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    nn_sleep (100);
    test_close (sc);

    return 0;
}